

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnetworkreplyimpl.cpp
# Opt level: O0

void __thiscall QNetworkReplyImplPrivate::metaDataChanged(QNetworkReplyImplPrivate *this)

{
  bool bVar1;
  int iVar2;
  QList<QByteArray> *values;
  QNetworkCookieJar *pQVar3;
  QNetworkReplyImplPrivate *in_RDI;
  long in_FS_OFFSET;
  QNetworkCookieJar *jar;
  QNetworkReplyImpl *q;
  QList<QNetworkCookie> cookies;
  optional<QList<QNetworkCookie>_> cookiesOpt;
  undefined7 in_stack_ffffffffffffff08;
  undefined1 in_stack_ffffffffffffff0f;
  QNetworkRequest *in_stack_ffffffffffffff10;
  undefined7 in_stack_ffffffffffffff18;
  byte bVar4;
  optional<QList<QNetworkCookie>_> *in_stack_ffffffffffffff28;
  Attribute code;
  undefined6 in_stack_ffffffffffffff30;
  undefined1 in_stack_ffffffffffffff36;
  byte bVar5;
  undefined1 in_stack_ffffffffffffff37;
  byte bVar6;
  undefined1 local_b8 [24];
  undefined8 local_a0;
  undefined8 local_98;
  undefined8 local_90;
  undefined8 local_68;
  undefined8 local_60;
  undefined8 local_58;
  undefined8 local_50;
  QVariant local_48;
  QVariant local_28;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  values = (QList<QByteArray> *)q_func(in_RDI);
  bVar1 = QPointer<QNetworkAccessManager>::isNull((QPointer<QNetworkAccessManager> *)0x1ec326);
  if (!bVar1) {
    local_68 = 0xaaaaaaaaaaaaaaaa;
    local_60 = 0xaaaaaaaaaaaaaaaa;
    local_58 = 0xaaaaaaaaaaaaaaaa;
    local_50 = 0xaaaaaaaaaaaaaaaa;
    QNetworkHeadersPrivate::headers
              ((QNetworkHeadersPrivate *)
               CONCAT17(in_stack_ffffffffffffff0f,in_stack_ffffffffffffff08));
    QHttpHeaders::values
              ((QHttpHeaders *)
               CONCAT17(in_stack_ffffffffffffff37,
                        CONCAT16(in_stack_ffffffffffffff36,in_stack_ffffffffffffff30)),
               (WellKnownHeader)((ulong)in_stack_ffffffffffffff28 >> 0x20));
    QNetworkHeadersPrivate::toSetCookieList(values);
    QList<QByteArray>::~QList((QList<QByteArray> *)0x1ec3b0);
    QHttpHeaders::~QHttpHeaders((QHttpHeaders *)0x1ec3ba);
    local_a0 = 0xaaaaaaaaaaaaaaaa;
    local_98 = 0xaaaaaaaaaaaaaaaa;
    local_90 = 0xaaaaaaaaaaaaaaaa;
    memset(local_b8,0,0x18);
    QList<QNetworkCookie>::QList((QList<QNetworkCookie> *)0x1ec3f9);
    std::optional<QList<QNetworkCookie>>::value_or<QList<QNetworkCookie>>
              (in_stack_ffffffffffffff28,(QList<QNetworkCookie> *)in_RDI);
    code = (Attribute)((ulong)in_stack_ffffffffffffff28 >> 0x20);
    QList<QNetworkCookie>::~QList((QList<QNetworkCookie> *)0x1ec41a);
    bVar1 = QList<QNetworkCookie>::empty((QList<QNetworkCookie> *)0x1ec424);
    bVar6 = 0;
    bVar5 = 0;
    bVar4 = false;
    if (!bVar1) {
      in_stack_ffffffffffffff10 = &(in_RDI->super_QNetworkReplyPrivate).request;
      QVariant::QVariant(&local_48,0);
      bVar6 = 1;
      QNetworkRequest::attribute
                ((QNetworkRequest *)CONCAT17(bVar4,in_stack_ffffffffffffff18),code,
                 (QVariant *)in_stack_ffffffffffffff10);
      bVar5 = 1;
      iVar2 = QVariant::toInt((bool *)&local_28);
      bVar4 = iVar2 == 0;
    }
    if ((bVar5 & 1) != 0) {
      QVariant::~QVariant(&local_28);
    }
    if ((bVar6 & 1) != 0) {
      QVariant::~QVariant(&local_48);
    }
    if ((bVar4 & 1) != 0) {
      QPointer<QNetworkAccessManager>::operator->((QPointer<QNetworkAccessManager> *)0x1ec4ed);
      pQVar3 = QNetworkAccessManager::cookieJar((QNetworkAccessManager *)in_stack_ffffffffffffff10);
      if (pQVar3 != (QNetworkCookieJar *)0x0) {
        (**(code **)(*(long *)pQVar3 + 0x68))
                  (pQVar3,&local_a0,&(in_RDI->super_QNetworkReplyPrivate).url);
      }
    }
    QList<QNetworkCookie>::~QList((QList<QNetworkCookie> *)0x1ec52a);
    std::optional<QList<QNetworkCookie>_>::~optional((optional<QList<QNetworkCookie>_> *)0x1ec537);
  }
  QNetworkReply::metaDataChanged((QNetworkReply *)0x1ec541);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QNetworkReplyImplPrivate::metaDataChanged()
{
    Q_Q(QNetworkReplyImpl);
    // 1. do we have cookies?
    // 2. are we allowed to set them?
    if (!manager.isNull()) {
        const auto cookiesOpt = QNetworkHeadersPrivate::toSetCookieList(
                headers().values(QHttpHeaders::WellKnownHeader::SetCookie));
        const auto cookies = cookiesOpt.value_or(QList<QNetworkCookie>());
        if (!cookies.empty()
            && request.attribute(QNetworkRequest::CookieSaveControlAttribute,
                                 QNetworkRequest::Automatic).toInt() == QNetworkRequest::Automatic) {
            QNetworkCookieJar *jar = manager->cookieJar();
            if (jar) {
                jar->setCookiesFromUrl(cookies, url);
            }
        }
    }

    emit q->metaDataChanged();
}